

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_cursor_tests.cpp
# Opt level: O2

void msgpack_stream_cursor_reset_test_traits::set_input
               (input_type *input,vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes)

{
  string s;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_30,
             (bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  std::__cxx11::stringbuf::str((string *)(input + 0x10));
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

static void set_input(input_type& input, std::vector<uint8_t> bytes)
    {
        auto data = reinterpret_cast<const char*>(bytes.data());
        std::string s(data, bytes.size());
        input.str(s);
    }